

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O1

void __thiscall OpenMD::MatrixAccumulator::add(MatrixAccumulator *this,ElementType *val)

{
  double dVar1;
  double dVar2;
  uint i;
  size_t sVar3;
  long lVar4;
  uint j;
  long lVar5;
  ResultType *pRVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  sVar3 = (this->super_BaseAccumulator).Count_ + 1;
  auVar8._8_4_ = (int)(sVar3 >> 0x20);
  auVar8._0_8_ = sVar3;
  auVar8._12_4_ = 0x45300000;
  (this->super_BaseAccumulator).Count_ = sVar3;
  dVar7 = (auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  pRVar6 = &this->Total_;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      dVar1 = pRVar6[-2].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar5];
      dVar2 = pRVar6[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar5];
      pRVar6[-2].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar5] =
           ((((SquareMatrix<double,_3> *)*(double (*) [3])val)->super_RectMatrix<double,_3U,_3U>).
            data_[0][lVar5] - dVar1) / dVar7 + dVar1;
      dVar1 = (((SquareMatrix<double,_3> *)*(double (*) [3])val)->super_RectMatrix<double,_3U,_3U>).
              data_[0][lVar5];
      pRVar6[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar5] =
           (dVar1 * dVar1 - dVar2) / dVar7 + dVar2;
      pRVar6[-3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar5] =
           (((SquareMatrix<double,_3> *)*(double (*) [3])val)->super_RectMatrix<double,_3U,_3U>).
           data_[0][lVar5];
      (pRVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar5] =
           (((SquareMatrix<double,_3> *)*(double (*) [3])val)->super_RectMatrix<double,_3U,_3U>).
           data_[0][lVar5] +
           (pRVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    val = (ElementType *)((long)val + 0x18);
    pRVar6 = (ResultType *)
             ((pRVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar4 != 3);
  return;
}

Assistant:

void add(ElementType const& val) {
      Count_++;
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          Avg_(i, j) += (val(i, j) - Avg_(i, j)) / Count_;
          Avg2_(i, j) += (val(i, j) * val(i, j) - Avg2_(i, j)) / Count_;
          Val_(i, j) = val(i, j);
          Total_(i, j) += val(i, j);
        }
      }
    }